

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_usage.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pVVar2;
  char **argv_00;
  App *pAVar3;
  Option *pOVar4;
  long *plVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  long *plVar7;
  string usage_msg;
  int subopt;
  int level;
  string output_file_name;
  string input_file_name;
  App app;
  long *local_970;
  long local_968;
  long local_960;
  long lStack_958;
  string local_950;
  int local_92c;
  int local_928 [2];
  _Any_data local_920;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_910;
  _Any_data local_900;
  code *local_8f0;
  undefined8 uStack_8e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_8e0;
  undefined8 local_8d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8d0;
  undefined4 local_8c0;
  undefined2 local_8bc;
  App *local_8b8;
  undefined1 *local_8b0;
  long local_8a8;
  undefined1 local_8a0 [16];
  char **local_890;
  string local_888;
  string local_868;
  undefined1 *local_848 [2];
  undefined1 local_838 [16];
  string local_828;
  string local_808;
  undefined1 *local_7e8 [2];
  undefined1 local_7d8 [16];
  string local_7c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  undefined1 *local_768;
  long local_760;
  undefined1 local_758 [16];
  undefined1 *local_748;
  long local_740;
  undefined1 local_738 [16];
  _Any_data local_728;
  code *local_718;
  long local_710;
  _Any_data local_708;
  code *local_6f8;
  undefined8 local_6f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6e8;
  undefined8 local_6e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6d8;
  undefined4 local_6c8;
  undefined2 local_6c4;
  string local_6c0;
  string local_6a0;
  undefined1 *local_680 [2];
  undefined1 local_670 [16];
  string local_660;
  string local_640;
  string local_620;
  string local_600;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  string local_580;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  _Any_data local_4e0;
  code *local_4d0;
  _Any_data local_4c0;
  code *local_4b0;
  char *local_4a0 [2];
  char local_490 [21];
  undefined1 uStack_47b;
  _Any_data local_478;
  code *local_468;
  _Any_data local_458;
  code *local_448;
  char *local_438 [2];
  char local_428 [21];
  undefined1 uStack_413;
  undefined1 *local_410 [2];
  undefined1 local_400 [16];
  undefined1 *local_3f0 [2];
  undefined1 local_3e0 [16];
  undefined1 *local_3d0 [2];
  undefined1 local_3c0 [16];
  undefined1 *local_3b0 [2];
  undefined1 local_3a0 [16];
  undefined1 local_390 [368];
  Option *local_220;
  Option *local_218;
  size_t local_a8;
  size_t local_a0;
  
  local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
  local_788._M_string_length = 0;
  local_788.field_2._M_local_buf[0] = '\0';
  local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
  local_7a8._M_string_length = 0;
  local_7a8.field_2._M_local_buf[0] = '\0';
  local_928[1] = 5;
  local_928[0] = 0;
  local_92c = argc;
  local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"CLI11 help","");
  local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"");
  CLI::App::App((App *)local_390,&local_500,&local_520);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != &local_520.field_2) {
    operator_delete(local_520._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != &local_500.field_2) {
    operator_delete(local_500._M_dataplus._M_p);
  }
  local_a8 = 1;
  local_a0 = 1;
  local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_540,"e","");
  local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_560,"encode","");
  pAVar3 = CLI::App::add_subcommand((App *)local_390,&local_540,&local_560);
  pAVar3 = CLI::App::ignore_case(pAVar3,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_dataplus._M_p != &local_560.field_2) {
    operator_delete(local_560._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540._M_dataplus._M_p != &local_540.field_2) {
    operator_delete(local_540._M_dataplus._M_p);
  }
  local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"input","");
  local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c8,"input file","");
  pOVar4 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar3,&local_580,&local_788,&local_7c8);
  local_7e8[0] = local_7d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7e8," ","");
  local_890 = argv;
  std::__cxx11::string::operator=((string *)&pOVar4->option_text_,(string *)local_7e8);
  (pOVar4->super_OptionBase<CLI::Option>).required_ = true;
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
            *)&local_478,
           (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
            *)CLI::ExistingFile);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_458,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)(CLI::ExistingFile + 0x20));
  local_438[0] = local_428;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_438,CLI::ExistingFile._64_8_,
             CLI::ExistingFile._72_8_ + CLI::ExistingFile._64_8_);
  register0x00000000 = CLI::ExistingFile._100_2_;
  local_428[0x10] = CLI::ExistingFile[0x60];
  local_428[0x11] = CLI::ExistingFile[0x61];
  local_428[0x12] = CLI::ExistingFile[0x62];
  local_428[0x13] = CLI::ExistingFile[99];
  local_970 = &local_960;
  local_8b8 = pAVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_970,"");
  stack0xfffffffffffffbec = CONCAT11(1,local_428[0x14]);
  CLI::std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::emplace_back<CLI::Validator>
            (&pOVar4->validators_,(Validator *)&local_478);
  if (local_968 != 0) {
    pVVar2 = (pOVar4->validators_).
             super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_920._M_unused._M_object = &local_910;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_920,local_970,local_968 + (long)local_970);
    std::__cxx11::string::operator=((string *)&pVVar2[-1].name_,(string *)local_920._M_pod_data);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_920._M_unused._0_8_ != &local_910) {
      operator_delete(local_920._M_unused._M_object);
    }
  }
  if (local_970 != &local_960) {
    operator_delete(local_970);
  }
  pAVar3 = local_8b8;
  if (local_438[0] != local_428) {
    operator_delete(local_438[0]);
  }
  if (local_448 != (code *)0x0) {
    (*local_448)(&local_458,&local_458,__destroy_functor);
  }
  if (local_468 != (code *)0x0) {
    (*local_468)(&local_478,&local_478,__destroy_functor);
  }
  if (local_7e8[0] != local_7d8) {
    operator_delete(local_7e8[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
    operator_delete(local_7c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_dataplus._M_p != &local_580.field_2) {
    operator_delete(local_580._M_dataplus._M_p);
  }
  local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"output","");
  local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c0,"output file","");
  pOVar4 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar3,&local_5a0,&local_7a8,&local_5c0);
  local_3b0[0] = local_3a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0," ","");
  std::__cxx11::string::operator=((string *)&pOVar4->option_text_,(string *)local_3b0);
  (pOVar4->super_OptionBase<CLI::Option>).required_ = true;
  if (local_3b0[0] != local_3a0) {
    operator_delete(local_3b0[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
    operator_delete(local_5c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
    operator_delete(local_5a0._M_dataplus._M_p);
  }
  local_808._M_dataplus._M_p = (pointer)&local_808.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_808,"-l, --level","");
  local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_828,"encoding level","");
  pOVar4 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (pAVar3,&local_808,local_928 + 1,&local_828);
  local_848[0] = local_838;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"[1..9]","");
  std::__cxx11::string::operator=((string *)&pOVar4->option_text_,(string *)local_848);
  local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
  local_950._M_string_length = 0;
  local_950.field_2._M_local_buf[0] = '\0';
  CLI::Range::Range<int>((Range *)&local_920,1,9,&local_950);
  local_728._M_unused._M_object =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_728._8_8_ = 0;
  local_718 = (code *)0x0;
  local_710 = local_910._8_8_;
  if ((code *)local_910._M_allocated_capacity != (code *)0x0) {
    local_728._M_unused._M_object = local_920._M_unused._M_object;
    local_728._8_8_ = local_920._8_8_;
    local_718 = (code *)local_910._M_allocated_capacity;
    local_910._M_allocated_capacity = 0;
    local_910._8_8_ = 0;
  }
  local_708._M_unused._M_object = (void *)0x0;
  local_708._8_8_ = 0;
  local_6f8 = (code *)0x0;
  local_6f0 = uStack_8e8;
  if (local_8f0 != (code *)0x0) {
    local_708._M_unused._M_object = local_900._M_unused._M_object;
    local_708._8_8_ = local_900._8_8_;
    local_6f8 = local_8f0;
    local_8f0 = (code *)0x0;
    uStack_8e8 = 0;
  }
  if (local_8e0 == &local_8d0) {
    local_6d8._8_4_ = local_8d0._8_4_;
    local_6d8._12_4_ = local_8d0._12_4_;
    local_6e8 = &local_6d8;
  }
  else {
    local_6e8 = local_8e0;
  }
  local_6e0 = local_8d8;
  local_8d8 = 0;
  local_8d0._M_allocated_capacity._0_4_ = local_8d0._M_allocated_capacity._0_4_ & 0xffffff00;
  local_6c8 = local_8c0;
  local_6c4 = local_8bc;
  local_8b0 = local_8a0;
  local_8e0 = &local_8d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8b0,"");
  local_6c4 = CONCAT11(1,(undefined1)local_6c4);
  CLI::std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::emplace_back<CLI::Validator>
            (&pOVar4->validators_,(Validator *)&local_728);
  if (local_8a8 != 0) {
    pVVar2 = (pOVar4->validators_).
             super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_970 = &local_960;
    std::__cxx11::string::_M_construct<char*>((string *)&local_970,local_8b0,local_8b0 + local_8a8);
    std::__cxx11::string::operator=((string *)&pVVar2[-1].name_,(string *)&local_970);
    pAVar3 = local_8b8;
    if (local_970 != &local_960) {
      operator_delete(local_970);
    }
  }
  local_970 = (long *)CONCAT44(local_970._4_4_,5);
  CLI::Option::default_val<int>(pOVar4,(int *)&local_970);
  if (local_8b0 != local_8a0) {
    operator_delete(local_8b0);
  }
  if (local_6e8 != &local_6d8) {
    operator_delete(local_6e8);
  }
  if (local_6f8 != (code *)0x0) {
    (*local_6f8)(&local_708,&local_708,__destroy_functor);
  }
  if (local_718 != (code *)0x0) {
    (*local_718)(&local_728,&local_728,__destroy_functor);
  }
  if (local_8e0 != &local_8d0) {
    operator_delete(local_8e0);
  }
  if (local_8f0 != (code *)0x0) {
    (*local_8f0)(&local_900,&local_900,__destroy_functor);
  }
  if ((code *)local_910._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_910._M_allocated_capacity)(&local_920,&local_920,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_950._M_dataplus._M_p != &local_950.field_2) {
    operator_delete(local_950._M_dataplus._M_p);
  }
  if (local_848[0] != local_838) {
    operator_delete(local_848[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_828._M_dataplus._M_p != &local_828.field_2) {
    operator_delete(local_828._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_808._M_dataplus._M_p != &local_808.field_2) {
    operator_delete(local_808._M_dataplus._M_p);
  }
  local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e0,"-R, --remove","");
  CLI::App::add_flag<const_char[18],_(CLI::detail::enabler)0>
            (pAVar3,&local_5e0,(char (*) [18])"remove input file");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
    operator_delete(local_5e0._M_dataplus._M_p);
  }
  local_600._M_dataplus._M_p = (pointer)&local_600.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_600,"-s, --suboption","");
  local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_620,"suboption","");
  pOVar4 = CLI::App::add_flag<int,_(CLI::detail::enabler)0>(pAVar3,&local_600,local_928,&local_620);
  local_3d0[0] = local_3c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0," ","");
  std::__cxx11::string::operator=((string *)&pOVar4->option_text_,(string *)local_3d0);
  if (local_3d0[0] != local_3c0) {
    operator_delete(local_3d0[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_620._M_dataplus._M_p != &local_620.field_2) {
    operator_delete(local_620._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_600._M_dataplus._M_p != &local_600.field_2) {
    operator_delete(local_600._M_dataplus._M_p);
  }
  local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_640,"d","");
  local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_660,"decode","");
  pAVar3 = CLI::App::add_subcommand((App *)local_390,&local_640,&local_660);
  pAVar3 = CLI::App::ignore_case(pAVar3,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660._M_dataplus._M_p != &local_660.field_2) {
    operator_delete(local_660._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_640._M_dataplus._M_p != &local_640.field_2) {
    operator_delete(local_640._M_dataplus._M_p);
  }
  local_868._M_dataplus._M_p = (pointer)&local_868.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_868,"input","");
  local_888._M_dataplus._M_p = (pointer)&local_888.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_888,"input file","");
  pOVar4 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar3,&local_868,&local_788,&local_888);
  local_680[0] = local_670;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_680," ","");
  std::__cxx11::string::operator=((string *)&pOVar4->option_text_,(string *)local_680);
  (pOVar4->super_OptionBase<CLI::Option>).required_ = true;
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
            *)&local_4e0,
           (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
            *)CLI::ExistingFile);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_4c0,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)(CLI::ExistingFile + 0x20));
  local_4a0[0] = local_490;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_4a0,CLI::ExistingFile._64_8_,
             CLI::ExistingFile._72_8_ + CLI::ExistingFile._64_8_);
  register0x00000000 = CLI::ExistingFile._100_2_;
  local_490[0x10] = CLI::ExistingFile[0x60];
  local_490[0x11] = CLI::ExistingFile[0x61];
  local_490[0x12] = CLI::ExistingFile[0x62];
  local_490[0x13] = CLI::ExistingFile[99];
  local_970 = &local_960;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_970,"");
  stack0xfffffffffffffb84 = CONCAT11(1,local_490[0x14]);
  CLI::std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::emplace_back<CLI::Validator>
            (&pOVar4->validators_,(Validator *)&local_4e0);
  if (local_968 != 0) {
    pVVar2 = (pOVar4->validators_).
             super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_920._M_unused._M_object = &local_910;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_920,local_970,local_968 + (long)local_970);
    std::__cxx11::string::operator=((string *)&pVVar2[-1].name_,(string *)local_920._M_pod_data);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_920._M_unused._0_8_ != &local_910) {
      operator_delete(local_920._M_unused._M_object);
    }
  }
  if (local_970 != &local_960) {
    operator_delete(local_970);
  }
  if (local_4a0[0] != local_490) {
    operator_delete(local_4a0[0]);
  }
  if (local_4b0 != (code *)0x0) {
    (*local_4b0)(&local_4c0,&local_4c0,__destroy_functor);
  }
  if (local_4d0 != (code *)0x0) {
    (*local_4d0)(&local_4e0,&local_4e0,__destroy_functor);
  }
  if (local_680[0] != local_670) {
    operator_delete(local_680[0]);
  }
  paVar1 = &local_950.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_888._M_dataplus._M_p != &local_888.field_2) {
    operator_delete(local_888._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868._M_dataplus._M_p != &local_868.field_2) {
    operator_delete(local_868._M_dataplus._M_p);
  }
  local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,"output","");
  local_6c0._M_dataplus._M_p = (pointer)&local_6c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c0,"output file","");
  pOVar4 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar3,&local_6a0,&local_7a8,&local_6c0);
  local_3f0[0] = local_3e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0," ","");
  std::__cxx11::string::operator=((string *)&pOVar4->option_text_,(string *)local_3f0);
  (pOVar4->super_OptionBase<CLI::Option>).required_ = true;
  if (local_3f0[0] != local_3e0) {
    operator_delete(local_3f0[0]);
  }
  argv_00 = local_890;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
    operator_delete(local_6c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
    operator_delete(local_6a0._M_dataplus._M_p);
  }
  std::__cxx11::string::string((string *)&local_950,*argv_00,(allocator *)&local_8b0);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_950,0,(char *)0x0,0x1321ac);
  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 == paVar6) {
    local_910._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_910._8_8_ = plVar5[3];
    local_920._M_unused._M_object = &local_910;
  }
  else {
    local_910._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_920._M_unused._M_object =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar5;
  }
  local_920._8_8_ = plVar5[1];
  *plVar5 = (long)paVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append(local_920._M_pod_data);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_960 = *plVar7;
    lStack_958 = plVar5[3];
    local_970 = &local_960;
  }
  else {
    local_960 = *plVar7;
    local_970 = (long *)*plVar5;
  }
  local_968 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_920._M_unused._0_8_ != &local_910) {
    operator_delete(local_920._M_unused._M_object);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_950._M_dataplus._M_p != paVar1) {
    operator_delete(local_950._M_dataplus._M_p);
  }
  local_410[0] = local_400;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_410,local_970,local_968 + (long)local_970);
  std::__cxx11::string::operator=((string *)(local_390 + 0xf0),(string *)local_410);
  if (local_410[0] != local_400) {
    operator_delete(local_410[0]);
  }
  local_748 = local_738;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_748,"");
  local_950._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_950,"");
  if (local_220 != (Option *)0x0) {
    CLI::App::remove_option((App *)local_390,local_220);
    local_220 = (Option *)0x0;
  }
  if (local_740 != 0) {
    local_920._M_unused._M_object = &local_910;
    std::__cxx11::string::_M_construct<char*>((string *)&local_920,local_748,local_748 + local_740);
    local_220 = CLI::App::
                add_flag<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                          ((App *)local_390,(string *)&local_920,&local_950);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_920._M_unused._0_8_ != &local_910) {
      operator_delete(local_920._M_unused._M_object);
    }
    (local_220->super_OptionBase<CLI::Option>).configurable_ = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_950._M_dataplus._M_p != paVar1) {
    operator_delete(local_950._M_dataplus._M_p);
  }
  if (local_748 != local_738) {
    operator_delete(local_748);
  }
  local_768 = local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"-h, --help","");
  local_950._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_950,"");
  if (local_218 != (Option *)0x0) {
    CLI::App::remove_option((App *)local_390,local_218);
    local_218 = (Option *)0x0;
  }
  if (local_760 != 0) {
    local_920._M_unused._M_object = &local_910;
    std::__cxx11::string::_M_construct<char*>((string *)&local_920,local_768,local_768 + local_760);
    local_218 = CLI::App::
                add_flag<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                          ((App *)local_390,(string *)&local_920,&local_950);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_920._M_unused._0_8_ != &local_910) {
      operator_delete(local_920._M_unused._M_object);
    }
    (local_218->super_OptionBase<CLI::Option>).configurable_ = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_950._M_dataplus._M_p != paVar1) {
    operator_delete(local_950._M_dataplus._M_p);
  }
  if (local_768 != local_758) {
    operator_delete(local_768);
  }
  CLI::App::parse_char_t<char>((App *)local_390,local_92c,argv_00);
  if (local_970 != &local_960) {
    operator_delete(local_970);
  }
  CLI::App::~App((App *)local_390);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
    operator_delete(local_7a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788._M_dataplus._M_p != &local_788.field_2) {
    operator_delete(local_788._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    std::string input_file_name, output_file_name;
    int level{5}, subopt{0};

    // app caption
    CLI::App app{"CLI11 help"};

    app.require_subcommand(1);
    // subcommands options and flags
    CLI::App *const encode = app.add_subcommand("e", "encode")->ignore_case();  // ignore case
    encode->add_option("input", input_file_name, "input file")
        ->option_text(" ")
        ->required()
        ->check(CLI::ExistingFile);                                                               // file must exist
    encode->add_option("output", output_file_name, "output file")->option_text(" ")->required();  // required option
    encode->add_option("-l, --level", level, "encoding level")
        ->option_text("[1..9]")
        ->check(CLI::Range(1, 9))
        ->default_val(5);                                   // limit parameter range
    encode->add_flag("-R, --remove", "remove input file");  // no parameter option
    encode->add_flag("-s, --suboption", subopt, "suboption")->option_text(" ");

    CLI::App *const decode = app.add_subcommand("d", "decode")->ignore_case();
    decode->add_option("input", input_file_name, "input file")->option_text(" ")->required()->check(CLI::ExistingFile);
    decode->add_option("output", output_file_name, "output file")->option_text(" ")->required();

    // Usage message modification
    std::string usage_msg = "Usage: " + std::string(argv[0]) + " <command> [options] <input-file> <output-file>";
    app.usage(usage_msg);
    // flag to display full help at once
    app.set_help_flag("");
    app.set_help_all_flag("-h, --help");

    CLI11_PARSE(app, argc, argv);

    return 0;
}